

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppLog::Clear(ExampleAppLog *this)

{
  int local_14;
  ExampleAppLog *local_10;
  ExampleAppLog *this_local;
  
  local_10 = this;
  ImGuiTextBuffer::clear(&this->Buf);
  ImVector<int>::clear(&this->LineOffsets);
  local_14 = 0;
  ImVector<int>::push_back(&this->LineOffsets,&local_14);
  return;
}

Assistant:

void    Clear()
    {
        Buf.clear();
        LineOffsets.clear();
        LineOffsets.push_back(0);
    }